

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>>
::find_or_prepare_insert_non_soo<google::protobuf::FieldDescriptor_const*>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>>
          *this,FieldDescriptor **key)

{
  ctrl_t *pcVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ushort uVar5;
  undefined1 auVar6 [16];
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  char cVar23;
  ushort uVar24;
  ctrl_t *pcVar25;
  slot_type *psVar26;
  uintptr_t v;
  bool bVar27;
  uint uVar28;
  ulong uVar29;
  size_t cap;
  size_t i;
  ulong uVar30;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  __m128i match;
  undefined1 auVar37 [16];
  iterator iVar38;
  FindInfo FVar39;
  ulong local_78;
  ctrl_t cVar31;
  ctrl_t cVar34;
  ctrl_t cVar35;
  ctrl_t cVar36;
  
  if (*(long *)this == 1) {
    __assert_fail("!is_soo()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xede,
                  "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, std::unique_ptr<const google::protobuf::TextFormat::FastFieldValuePrinter>>, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, std::unique_ptr<const google::protobuf::TextFormat::FastFieldValuePrinter>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, std::unique_ptr<const google::protobuf::TextFormat::FastFieldValuePrinter>>, Hash = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, std::unique_ptr<const google::protobuf::TextFormat::FastFieldValuePrinter>>>, K = const google::protobuf::FieldDescriptor *]"
                 );
  }
  if (*(long *)this != 0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
    ::prefetch_heap_block
              ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
                *)this);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)*key;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = &(*key)->super_SymbolBase +
                   (SUB168(auVar32 * ZEXT816(0x9ddfea08eb382d69),0) ^
                   SUB168(auVar32 * ZEXT816(0x9ddfea08eb382d69),8));
    uVar2 = *(ulong *)this;
    if ((uVar2 + 1 & uVar2) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x145,
                    "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                   );
    }
    uVar29 = SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),8) ^
             SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),0);
    uVar30 = uVar29 >> 7 ^ *(ulong *)(this + 0x10) >> 0xc;
    pcVar25 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
              ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
                         *)this);
    auVar32 = ZEXT216(CONCAT11((char)uVar29,(char)uVar29) & 0x7f7f);
    auVar32 = pshuflw(auVar32,auVar32,0);
    local_78 = 0;
    while( true ) {
      uVar30 = uVar30 & uVar2;
      pcVar1 = pcVar25 + uVar30;
      cVar7 = *pcVar1;
      cVar8 = pcVar1[1];
      cVar9 = pcVar1[2];
      cVar10 = pcVar1[3];
      cVar11 = pcVar1[4];
      cVar12 = pcVar1[5];
      cVar13 = pcVar1[6];
      cVar14 = pcVar1[7];
      cVar15 = pcVar1[8];
      cVar16 = pcVar1[9];
      cVar17 = pcVar1[10];
      cVar18 = pcVar1[0xb];
      cVar19 = pcVar1[0xc];
      cVar20 = pcVar1[0xd];
      cVar21 = pcVar1[0xe];
      cVar22 = pcVar1[0xf];
      cVar31 = auVar32[0];
      auVar33[0] = -(cVar31 == cVar7);
      cVar34 = auVar32[1];
      auVar33[1] = -(cVar34 == cVar8);
      cVar35 = auVar32[2];
      auVar33[2] = -(cVar35 == cVar9);
      cVar36 = auVar32[3];
      auVar33[3] = -(cVar36 == cVar10);
      auVar33[4] = -(cVar31 == cVar11);
      auVar33[5] = -(cVar34 == cVar12);
      auVar33[6] = -(cVar35 == cVar13);
      auVar33[7] = -(cVar36 == cVar14);
      auVar33[8] = -(cVar31 == cVar15);
      auVar33[9] = -(cVar34 == cVar16);
      auVar33[10] = -(cVar35 == cVar17);
      auVar33[0xb] = -(cVar36 == cVar18);
      auVar33[0xc] = -(cVar31 == cVar19);
      auVar33[0xd] = -(cVar34 == cVar20);
      auVar33[0xe] = -(cVar35 == cVar21);
      auVar33[0xf] = -(cVar36 == cVar22);
      uVar24 = (ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf;
      uVar28 = (uint)uVar24;
      while (uVar24 != 0) {
        uVar4 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        psVar26 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
                  ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
                                *)this);
        i = uVar4 + uVar30 & uVar2;
        if (psVar26[i].value.first == *key) {
          bVar27 = false;
          goto LAB_00304f06;
        }
        uVar24 = (ushort)(uVar28 - 1) & (ushort)uVar28;
        uVar28 = CONCAT22((short)(uVar28 - 1 >> 0x10),uVar24);
      }
      auVar37[0] = -(cVar7 == kEmpty);
      auVar37[1] = -(cVar8 == kEmpty);
      auVar37[2] = -(cVar9 == kEmpty);
      auVar37[3] = -(cVar10 == kEmpty);
      auVar37[4] = -(cVar11 == kEmpty);
      auVar37[5] = -(cVar12 == kEmpty);
      auVar37[6] = -(cVar13 == kEmpty);
      auVar37[7] = -(cVar14 == kEmpty);
      auVar37[8] = -(cVar15 == kEmpty);
      auVar37[9] = -(cVar16 == kEmpty);
      auVar37[10] = -(cVar17 == kEmpty);
      auVar37[0xb] = -(cVar18 == kEmpty);
      auVar37[0xc] = -(cVar19 == kEmpty);
      auVar37[0xd] = -(cVar20 == kEmpty);
      auVar37[0xe] = -(cVar21 == kEmpty);
      auVar37[0xf] = -(cVar22 == kEmpty);
      uVar24 = (ushort)(SUB161(auVar37 >> 7,0) & 1) | (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe | (ushort)(auVar37[0xf] >> 7) << 0xf;
      uVar3 = *(ulong *)this;
      if (uVar24 != 0) break;
      if (uVar3 == 0) goto LAB_00304f32;
      uVar30 = uVar30 + local_78 + 0x10;
      local_78 = local_78 + 0x10;
      if (uVar3 < local_78) {
        __assert_fail("seq.index() <= capacity() && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xef5,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, std::unique_ptr<const google::protobuf::TextFormat::FastFieldValuePrinter>>, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, std::unique_ptr<const google::protobuf::TextFormat::FastFieldValuePrinter>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, std::unique_ptr<const google::protobuf::TextFormat::FastFieldValuePrinter>>, Hash = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, std::unique_ptr<const google::protobuf::TextFormat::FastFieldValuePrinter>>>, K = const google::protobuf::FieldDescriptor *]"
                     );
      }
    }
    if (uVar3 != 0) {
      pcVar25 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
                ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
                           *)this);
      cVar23 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                         (uVar3,uVar29,pcVar25);
      if (cVar23 == '\0') {
        uVar28 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
      }
      else {
        uVar5 = 0xf;
        if (uVar24 != 0) {
          for (; uVar24 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar28 = (ushort)((uVar5 ^ 0xfff0) + 0x11) - 1;
      }
      FVar39.offset = uVar28 + uVar30 & uVar2;
      FVar39.probe_length = local_78;
      i = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                    ((CommonFields *)this,uVar29,FVar39,
                     (PolicyFunctions *)GetPolicyFunctions()::value);
      bVar27 = true;
LAB_00304f06:
      iVar38 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
               ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
                              *)this,i);
      __return_storage_ptr__->first = iVar38;
      __return_storage_ptr__->second = bVar27;
      return __return_storage_ptr__;
    }
  }
LAB_00304f32:
  __assert_fail("!kEnabled || cap >= kCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb37,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, std::unique_ptr<const google::protobuf::TextFormat::FastFieldValuePrinter>>, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, std::unique_ptr<const google::protobuf::TextFormat::FastFieldValuePrinter>>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, std::unique_ptr<const google::protobuf::TextFormat::FastFieldValuePrinter>>, Hash = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, std::unique_ptr<const google::protobuf::TextFormat::FastFieldValuePrinter>>>]"
               );
}

Assistant:

size_t capacity() const { return capacity_; }